

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall CMU462::AppConfig::AppConfig(AppConfig *this)

{
  (this->pathtracer_result_path)._M_dataplus._M_p = (pointer)&(this->pathtracer_result_path).field_2
  ;
  (this->pathtracer_result_path)._M_string_length = 0;
  (this->pathtracer_result_path).field_2._M_local_buf[0] = '\0';
  this->pathtracer_ns_aa = 1;
  this->pathtracer_max_ray_depth = 1;
  this->pathtracer_ns_area_light = 4;
  this->pathtracer_ns_diff = 1;
  this->pathtracer_ns_glsy = 1;
  this->pathtracer_ns_refr = 1;
  this->pathtracer_num_threads = 1;
  this->pathtracer_envmap = (HDRImageBuffer *)0x0;
  std::__cxx11::string::_M_replace((ulong)&this->pathtracer_result_path,0,(char *)0x0,0x1f055a);
  return;
}

Assistant:

AppConfig() {
    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 4;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;
    pathtracer_result_path = "";
  }